

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getarg_tests.cpp
# Opt level: O2

void __thiscall getarg_tests::stringarg::test_method(stringarg *this)

{
  long lVar1;
  long lVar2;
  iterator in_R8;
  iterator pvVar3;
  iterator in_R9;
  string *psVar4;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  __l;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  char *local_538;
  char *local_530;
  undefined1 *local_528;
  undefined1 *local_520;
  char *local_518;
  char *local_510;
  char *local_508;
  char *local_500;
  undefined1 *local_4f8;
  undefined1 *local_4f0;
  char *local_4e8;
  char *local_4e0;
  char *local_4d8;
  char *local_4d0;
  undefined1 *local_4c8;
  undefined1 *local_4c0;
  char *local_4b8;
  char *local_4b0;
  char *local_4a8;
  char *local_4a0;
  undefined1 *local_498;
  undefined1 *local_490;
  char *local_488;
  char *local_480;
  char *local_478;
  char *local_470;
  undefined1 *local_468;
  undefined1 *local_460;
  char *local_458;
  char *local_450;
  char *local_448;
  char *local_440;
  undefined1 *local_438;
  undefined1 *local_430;
  char *local_428;
  char *local_420;
  char *local_418;
  char *local_410;
  undefined1 *local_408;
  undefined1 *local_400;
  char *local_3f8;
  char *local_3f0;
  char *local_3e8;
  char *local_3e0;
  undefined1 *local_3d8;
  undefined1 *local_3d0;
  char *local_3c8;
  char *local_3c0;
  char *local_3b8;
  char *local_3b0;
  undefined1 *local_3a8;
  undefined1 *local_3a0;
  char *local_398;
  char *local_390;
  allocator<char> local_382;
  allocator<char> local_381;
  char *local_380;
  char *local_378;
  undefined1 *local_370;
  undefined1 *local_368;
  char *local_360;
  char *local_358;
  pair<const_char_*,_ArgsManager::Flags> local_350;
  pair<const_char_*,_ArgsManager::Flags> local_340;
  string local_330;
  string local_310;
  string local_2f0;
  undefined1 local_2d0 [40];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_2a8;
  ArgsManager local_args;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ArgsManager::ArgsManager(&local_args);
  local_340.first = "-foo";
  local_350.second = ALLOW_ANY;
  local_350.first = "-bar";
  local_340.second = local_350.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_*,_ArgsManager::Flags,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
              *)local_2d0,&local_340);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_*,_ArgsManager::Flags,_true>(&local_2a8,&local_350);
  __l._M_len = 2;
  __l._M_array = (iterator)local_2d0;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
            *)&local_2f0,__l,(allocator_type *)&local_310);
  SetupArgs(&local_args,
            (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             *)&local_2f0);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             *)&local_2f0);
  lVar2 = 0x28;
  do {
    std::__cxx11::string::~string((string *)(local_2d0 + lVar2));
    lVar2 = lVar2 + -0x28;
  } while (lVar2 != -0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2d0,"",(allocator<char> *)&local_2f0);
  ResetArgs(&local_args,(string *)local_2d0);
  std::__cxx11::string::~string((string *)local_2d0);
  local_360 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_358 = "";
  local_370 = &boost::unit_test::basic_cstring<char_const>::null;
  local_368 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0xdf;
  file.m_begin = (iterator)&local_360;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_370,msg);
  local_2d0[8] = 0;
  local_2d0._0_8_ = &PTR__lazy_ostream_01139f30;
  local_2d0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2d0._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_380 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_378 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_310,"-foo",&local_381);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_330,"",&local_382);
  ArgsManager::GetArg(&local_2f0,&local_args,&local_310,&local_330);
  pvVar3 = (iterator)0x2;
  psVar4 = &local_2f0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[1]>
            (local_2d0,&local_380,0xdf,1,2,psVar4,"local_args.GetArg(\"-foo\", \"\")","","\"\"");
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::~string((string *)&local_330);
  std::__cxx11::string::~string((string *)&local_310);
  local_398 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_390 = "";
  local_3a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3a0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = (iterator)psVar4;
  msg_00.m_begin = pvVar3;
  file_00.m_end = (iterator)0xe0;
  file_00.m_begin = (iterator)&local_398;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_3a8,
             msg_00);
  local_2d0[8] = 0;
  local_2d0._0_8_ = &PTR__lazy_ostream_01139f30;
  local_2d0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2d0._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_3b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_3b0 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_310,"-foo",&local_381);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_330,"eleven",&local_382);
  ArgsManager::GetArg(&local_2f0,&local_args,&local_310,&local_330);
  pvVar3 = (iterator)0x2;
  psVar4 = &local_2f0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[7]>
            (local_2d0,&local_3b8,0xe0,1,2,psVar4,"local_args.GetArg(\"-foo\", \"eleven\")","eleven"
             ,"\"eleven\"");
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::~string((string *)&local_330);
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2d0,"-foo -bar",(allocator<char> *)&local_2f0);
  ResetArgs(&local_args,(string *)local_2d0);
  std::__cxx11::string::~string((string *)local_2d0);
  local_3c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_3c0 = "";
  local_3d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3d0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = (iterator)psVar4;
  msg_01.m_begin = pvVar3;
  file_01.m_end = (iterator)0xe3;
  file_01.m_begin = (iterator)&local_3c8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_3d8,
             msg_01);
  local_2d0[8] = 0;
  local_2d0._0_8_ = &PTR__lazy_ostream_01139f30;
  local_2d0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2d0._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_3e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_3e0 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_310,"-foo",&local_381);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_330,"",&local_382);
  ArgsManager::GetArg(&local_2f0,&local_args,&local_310,&local_330);
  pvVar3 = (iterator)0x2;
  psVar4 = &local_2f0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[1]>
            (local_2d0,&local_3e8,0xe3,1,2,psVar4,"local_args.GetArg(\"-foo\", \"\")","","\"\"");
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::~string((string *)&local_330);
  std::__cxx11::string::~string((string *)&local_310);
  local_3f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_3f0 = "";
  local_408 = &boost::unit_test::basic_cstring<char_const>::null;
  local_400 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = (iterator)psVar4;
  msg_02.m_begin = pvVar3;
  file_02.m_end = (iterator)0xe4;
  file_02.m_begin = (iterator)&local_3f8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_408,
             msg_02);
  local_2d0[8] = 0;
  local_2d0._0_8_ = &PTR__lazy_ostream_01139f30;
  local_2d0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2d0._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_418 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_410 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_310,"-foo",&local_381);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_330,"eleven",&local_382);
  ArgsManager::GetArg(&local_2f0,&local_args,&local_310,&local_330);
  pvVar3 = (iterator)0x2;
  psVar4 = &local_2f0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[1]>
            (local_2d0,&local_418,0xe4,1,2,psVar4,"local_args.GetArg(\"-foo\", \"eleven\")","",
             "\"\"");
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::~string((string *)&local_330);
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2d0,"-foo=",(allocator<char> *)&local_2f0);
  ResetArgs(&local_args,(string *)local_2d0);
  std::__cxx11::string::~string((string *)local_2d0);
  local_428 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_420 = "";
  local_438 = &boost::unit_test::basic_cstring<char_const>::null;
  local_430 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_03.m_end = (iterator)psVar4;
  msg_03.m_begin = pvVar3;
  file_03.m_end = (iterator)0xe7;
  file_03.m_begin = (iterator)&local_428;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_438,
             msg_03);
  local_2d0[8] = 0;
  local_2d0._0_8_ = &PTR__lazy_ostream_01139f30;
  local_2d0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2d0._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_448 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_440 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_310,"-foo",&local_381);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_330,"",&local_382);
  ArgsManager::GetArg(&local_2f0,&local_args,&local_310,&local_330);
  pvVar3 = (iterator)0x2;
  psVar4 = &local_2f0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[1]>
            (local_2d0,&local_448,0xe7,1,2,psVar4,"local_args.GetArg(\"-foo\", \"\")","","\"\"");
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::~string((string *)&local_330);
  std::__cxx11::string::~string((string *)&local_310);
  local_458 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_450 = "";
  local_468 = &boost::unit_test::basic_cstring<char_const>::null;
  local_460 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_04.m_end = (iterator)psVar4;
  msg_04.m_begin = pvVar3;
  file_04.m_end = (iterator)0xe8;
  file_04.m_begin = (iterator)&local_458;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_468,
             msg_04);
  local_2d0[8] = 0;
  local_2d0._0_8_ = &PTR__lazy_ostream_01139f30;
  local_2d0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2d0._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_478 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_470 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_310,"-foo",&local_381);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_330,"eleven",&local_382);
  ArgsManager::GetArg(&local_2f0,&local_args,&local_310,&local_330);
  pvVar3 = (iterator)0x2;
  psVar4 = &local_2f0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[1]>
            (local_2d0,&local_478,0xe8,1,2,psVar4,"local_args.GetArg(\"-foo\", \"eleven\")","",
             "\"\"");
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::~string((string *)&local_330);
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2d0,"-foo=11",(allocator<char> *)&local_2f0);
  ResetArgs(&local_args,(string *)local_2d0);
  std::__cxx11::string::~string((string *)local_2d0);
  local_488 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_480 = "";
  local_498 = &boost::unit_test::basic_cstring<char_const>::null;
  local_490 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_05.m_end = (iterator)psVar4;
  msg_05.m_begin = pvVar3;
  file_05.m_end = (iterator)0xeb;
  file_05.m_begin = (iterator)&local_488;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_498,
             msg_05);
  local_2d0[8] = 0;
  local_2d0._0_8_ = &PTR__lazy_ostream_01139f30;
  local_2d0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2d0._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_4a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_4a0 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_310,"-foo",&local_381);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_330,"",&local_382);
  ArgsManager::GetArg(&local_2f0,&local_args,&local_310,&local_330);
  pvVar3 = (iterator)0x2;
  psVar4 = &local_2f0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[3]>
            (local_2d0,&local_4a8,0xeb,1,2,psVar4,"local_args.GetArg(\"-foo\", \"\")","11","\"11\"")
  ;
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::~string((string *)&local_330);
  std::__cxx11::string::~string((string *)&local_310);
  local_4b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_4b0 = "";
  local_4c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4c0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_06.m_end = (iterator)psVar4;
  msg_06.m_begin = pvVar3;
  file_06.m_end = (iterator)0xec;
  file_06.m_begin = (iterator)&local_4b8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_4c8,
             msg_06);
  local_2d0[8] = 0;
  local_2d0._0_8_ = &PTR__lazy_ostream_01139f30;
  local_2d0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2d0._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_4d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_4d0 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_310,"-foo",&local_381);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_330,"eleven",&local_382);
  ArgsManager::GetArg(&local_2f0,&local_args,&local_310,&local_330);
  pvVar3 = (iterator)0x2;
  psVar4 = &local_2f0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[3]>
            (local_2d0,&local_4d8,0xec,1,2,psVar4,"local_args.GetArg(\"-foo\", \"eleven\")","11",
             "\"11\"");
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::~string((string *)&local_330);
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2d0,"-foo=eleven",(allocator<char> *)&local_2f0);
  ResetArgs(&local_args,(string *)local_2d0);
  std::__cxx11::string::~string((string *)local_2d0);
  local_4e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_4e0 = "";
  local_4f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4f0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_07.m_end = (iterator)psVar4;
  msg_07.m_begin = pvVar3;
  file_07.m_end = (iterator)0xef;
  file_07.m_begin = (iterator)&local_4e8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_4f8,
             msg_07);
  local_2d0[8] = 0;
  local_2d0._0_8_ = &PTR__lazy_ostream_01139f30;
  local_2d0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2d0._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_508 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_500 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_310,"-foo",&local_381);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_330,"",&local_382);
  ArgsManager::GetArg(&local_2f0,&local_args,&local_310,&local_330);
  pvVar3 = (iterator)0x2;
  psVar4 = &local_2f0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[7]>
            (local_2d0,&local_508,0xef,1,2,psVar4,"local_args.GetArg(\"-foo\", \"\")","eleven",
             "\"eleven\"");
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::~string((string *)&local_330);
  std::__cxx11::string::~string((string *)&local_310);
  local_518 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_510 = "";
  local_528 = &boost::unit_test::basic_cstring<char_const>::null;
  local_520 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_08.m_end = (iterator)psVar4;
  msg_08.m_begin = pvVar3;
  file_08.m_end = (iterator)0xf0;
  file_08.m_begin = (iterator)&local_518;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_528,
             msg_08);
  local_2d0[8] = 0;
  local_2d0._0_8_ = &PTR__lazy_ostream_01139f30;
  local_2d0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2d0._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_538 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_530 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_310,"-foo",&local_381);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_330,"eleven",&local_382);
  ArgsManager::GetArg(&local_2f0,&local_args,&local_310,&local_330);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[7]>
            (local_2d0,&local_538,0xf0,1,2,&local_2f0,"local_args.GetArg(\"-foo\", \"eleven\")",
             "eleven","\"eleven\"");
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::~string((string *)&local_330);
  std::__cxx11::string::~string((string *)&local_310);
  ArgsManager::~ArgsManager(&local_args);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(stringarg)
{
    ArgsManager local_args;

    const auto foo = std::make_pair("-foo", ArgsManager::ALLOW_ANY);
    const auto bar = std::make_pair("-bar", ArgsManager::ALLOW_ANY);
    SetupArgs(local_args, {foo, bar});
    ResetArgs(local_args, "");
    BOOST_CHECK_EQUAL(local_args.GetArg("-foo", ""), "");
    BOOST_CHECK_EQUAL(local_args.GetArg("-foo", "eleven"), "eleven");

    ResetArgs(local_args, "-foo -bar");
    BOOST_CHECK_EQUAL(local_args.GetArg("-foo", ""), "");
    BOOST_CHECK_EQUAL(local_args.GetArg("-foo", "eleven"), "");

    ResetArgs(local_args, "-foo=");
    BOOST_CHECK_EQUAL(local_args.GetArg("-foo", ""), "");
    BOOST_CHECK_EQUAL(local_args.GetArg("-foo", "eleven"), "");

    ResetArgs(local_args, "-foo=11");
    BOOST_CHECK_EQUAL(local_args.GetArg("-foo", ""), "11");
    BOOST_CHECK_EQUAL(local_args.GetArg("-foo", "eleven"), "11");

    ResetArgs(local_args, "-foo=eleven");
    BOOST_CHECK_EQUAL(local_args.GetArg("-foo", ""), "eleven");
    BOOST_CHECK_EQUAL(local_args.GetArg("-foo", "eleven"), "eleven");
}